

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O3

void aom_subtract_block_avx2
               (int rows,int cols,int16_t *diff_ptr,ptrdiff_t diff_stride,uint8_t *src_ptr,
               ptrdiff_t src_stride,uint8_t *pred_ptr,ptrdiff_t pred_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  switch(cols << 0x1c | cols - 0x10U >> 4) {
  case 0:
    if (0 < rows) {
      do {
        auVar1 = vlddqu_avx(*(undefined1 (*) [16])src_ptr);
        auVar2 = vlddqu_avx(*(undefined1 (*) [16])pred_ptr);
        auVar7 = vpmovzxbw_avx2(auVar1);
        auVar5 = vpmovzxbw_avx2(auVar2);
        auVar7 = vpsubw_avx2(auVar7,auVar5);
        *(undefined1 (*) [32])diff_ptr = auVar7;
        src_ptr = *(undefined1 (*) [16])src_ptr + src_stride;
        pred_ptr = *(undefined1 (*) [16])pred_ptr + pred_stride;
        diff_ptr = (int16_t *)(*(undefined1 (*) [32])diff_ptr + diff_stride * 2);
        rows = rows + -1;
      } while (rows != 0);
    }
    break;
  case 1:
    if (0 < rows) {
      pauVar3 = (undefined1 (*) [32])(diff_ptr + 0x10);
      auVar6._8_2_ = 0xff01;
      auVar6._0_8_ = 0xff01ff01ff01ff01;
      auVar6._10_2_ = 0xff01;
      auVar6._12_2_ = 0xff01;
      auVar6._14_2_ = 0xff01;
      auVar6._16_2_ = 0xff01;
      auVar6._18_2_ = 0xff01;
      auVar6._20_2_ = 0xff01;
      auVar6._22_2_ = 0xff01;
      auVar6._24_2_ = 0xff01;
      auVar6._26_2_ = 0xff01;
      auVar6._28_2_ = 0xff01;
      auVar6._30_2_ = 0xff01;
      do {
        auVar7 = vlddqu_avx(*(undefined1 (*) [32])src_ptr);
        auVar5 = vlddqu_avx(*(undefined1 (*) [32])pred_ptr);
        auVar11 = vpunpcklbw_avx2(auVar7,auVar5);
        auVar5 = vpunpckhbw_avx2(auVar7,auVar5);
        auVar7 = vpmaddubsw_avx2(auVar11,auVar6);
        auVar5 = vpmaddubsw_avx2(auVar5,auVar6);
        auVar10._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar7._0_16_;
        auVar10._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar5._0_16_;
        pauVar3[-1] = auVar10;
        auVar7 = vperm2i128_avx2(auVar7,auVar5,0x31);
        *pauVar3 = auVar7;
        src_ptr = *(undefined1 (*) [32])src_ptr + src_stride;
        pred_ptr = *(undefined1 (*) [32])pred_ptr + pred_stride;
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + diff_stride * 2);
        rows = rows + -1;
      } while (rows != 0);
    }
    break;
  default:
    aom_subtract_block_sse2();
    return;
  case 3:
    if (0 < rows) {
      pauVar3 = (undefined1 (*) [32])(diff_ptr + 0x30);
      auVar5._8_2_ = 0xff01;
      auVar5._0_8_ = 0xff01ff01ff01ff01;
      auVar5._10_2_ = 0xff01;
      auVar5._12_2_ = 0xff01;
      auVar5._14_2_ = 0xff01;
      auVar5._16_2_ = 0xff01;
      auVar5._18_2_ = 0xff01;
      auVar5._20_2_ = 0xff01;
      auVar5._22_2_ = 0xff01;
      auVar5._24_2_ = 0xff01;
      auVar5._26_2_ = 0xff01;
      auVar5._28_2_ = 0xff01;
      auVar5._30_2_ = 0xff01;
      do {
        auVar7 = vlddqu_avx(*(undefined1 (*) [32])src_ptr);
        auVar6 = vlddqu_avx(*(undefined1 (*) [32])pred_ptr);
        auVar11 = vpunpcklbw_avx2(auVar7,auVar6);
        auVar6 = vpunpckhbw_avx2(auVar7,auVar6);
        auVar7 = vpmaddubsw_avx2(auVar11,auVar5);
        auVar6 = vpmaddubsw_avx2(auVar6,auVar5);
        auVar8._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar7._0_16_;
        auVar8._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar6._0_16_;
        pauVar3[-3] = auVar8;
        auVar7 = vperm2i128_avx2(auVar7,auVar6,0x31);
        pauVar3[-2] = auVar7;
        auVar7 = vlddqu_avx(*(undefined1 (*) [32])((long)src_ptr + 0x20));
        auVar6 = vlddqu_avx(*(undefined1 (*) [32])((long)pred_ptr + 0x20));
        auVar11 = vpunpcklbw_avx2(auVar7,auVar6);
        auVar6 = vpunpckhbw_avx2(auVar7,auVar6);
        auVar7 = vpmaddubsw_avx2(auVar11,auVar5);
        auVar6 = vpmaddubsw_avx2(auVar6,auVar5);
        auVar9._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar7._0_16_;
        auVar9._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar6._0_16_;
        pauVar3[-1] = auVar9;
        auVar7 = vperm2i128_avx2(auVar7,auVar6,0x31);
        *pauVar3 = auVar7;
        src_ptr = *(undefined1 (*) [32])src_ptr + src_stride;
        pred_ptr = *(undefined1 (*) [32])pred_ptr + pred_stride;
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + diff_stride * 2);
        rows = rows + -1;
      } while (rows != 0);
    }
    break;
  case 7:
    if (0 < rows) {
      pauVar3 = (undefined1 (*) [32])(diff_ptr + 0x70);
      pauVar4 = (undefined1 (*) [32])(pred_ptr + 0x60);
      auVar7._8_2_ = 0xff01;
      auVar7._0_8_ = 0xff01ff01ff01ff01;
      auVar7._10_2_ = 0xff01;
      auVar7._12_2_ = 0xff01;
      auVar7._14_2_ = 0xff01;
      auVar7._16_2_ = 0xff01;
      auVar7._18_2_ = 0xff01;
      auVar7._20_2_ = 0xff01;
      auVar7._22_2_ = 0xff01;
      auVar7._24_2_ = 0xff01;
      auVar7._26_2_ = 0xff01;
      auVar7._28_2_ = 0xff01;
      auVar7._30_2_ = 0xff01;
      do {
        auVar5 = vlddqu_avx(*(undefined1 (*) [32])src_ptr);
        auVar6 = vlddqu_avx(pauVar4[-3]);
        auVar11 = vpunpcklbw_avx2(auVar5,auVar6);
        auVar6 = vpunpckhbw_avx2(auVar5,auVar6);
        auVar5 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar6 = vpmaddubsw_avx2(auVar6,auVar7);
        auVar11._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar11._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar6._0_16_;
        pauVar3[-7] = auVar11;
        auVar5 = vperm2i128_avx2(auVar5,auVar6,0x31);
        pauVar3[-6] = auVar5;
        auVar5 = vlddqu_avx(*(undefined1 (*) [32])((long)src_ptr + 0x20));
        auVar6 = vlddqu_avx(pauVar4[-2]);
        auVar11 = vpunpcklbw_avx2(auVar5,auVar6);
        auVar6 = vpunpckhbw_avx2(auVar5,auVar6);
        auVar5 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar6 = vpmaddubsw_avx2(auVar6,auVar7);
        auVar12._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar12._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar6._0_16_;
        pauVar3[-5] = auVar12;
        auVar5 = vperm2i128_avx2(auVar5,auVar6,0x31);
        pauVar3[-4] = auVar5;
        auVar5 = vlddqu_avx(*(undefined1 (*) [32])((long)src_ptr + 0x40));
        auVar6 = vlddqu_avx(pauVar4[-1]);
        auVar11 = vpunpcklbw_avx2(auVar5,auVar6);
        auVar6 = vpunpckhbw_avx2(auVar5,auVar6);
        auVar5 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar6 = vpmaddubsw_avx2(auVar6,auVar7);
        auVar13._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar13._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar6._0_16_;
        pauVar3[-3] = auVar13;
        auVar5 = vperm2i128_avx2(auVar5,auVar6,0x31);
        pauVar3[-2] = auVar5;
        auVar5 = vlddqu_avx(*(undefined1 (*) [32])((long)src_ptr + 0x60));
        auVar6 = vlddqu_avx(*pauVar4);
        auVar11 = vpunpcklbw_avx2(auVar5,auVar6);
        auVar6 = vpunpckhbw_avx2(auVar5,auVar6);
        auVar5 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar6 = vpmaddubsw_avx2(auVar6,auVar7);
        auVar14._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar5._0_16_;
        auVar14._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar6._0_16_;
        pauVar3[-1] = auVar14;
        auVar5 = vperm2i128_avx2(auVar5,auVar6,0x31);
        *pauVar3 = auVar5;
        src_ptr = *(undefined1 (*) [32])src_ptr + src_stride;
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + diff_stride * 2);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + pred_stride);
        rows = rows + -1;
      } while (rows != 0);
    }
  }
  return;
}

Assistant:

void aom_subtract_block_avx2(int rows, int cols, int16_t *diff_ptr,
                             ptrdiff_t diff_stride, const uint8_t *src_ptr,
                             ptrdiff_t src_stride, const uint8_t *pred_ptr,
                             ptrdiff_t pred_stride) {
  switch (cols) {
    case 16:
      subtract_block_16xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 32:
      subtract_block_32xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 64:
      subtract_block_64xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 128:
      subtract_block_128xn_avx2(rows, diff_ptr, diff_stride, src_ptr,
                                src_stride, pred_ptr, pred_stride);
      break;
    default:
      aom_subtract_block_sse2(rows, cols, diff_ptr, diff_stride, src_ptr,
                              src_stride, pred_ptr, pred_stride);
      break;
  }
}